

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.c
# Opt level: O1

int cm_zlib_compress2(Bytef *dest,uLongf *destLen,Bytef *source,uLong sourceLen,int level)

{
  int iVar1;
  int iVar2;
  z_stream_conflict local_80;
  
  local_80.avail_in = (uInt)sourceLen;
  local_80.avail_out = (uInt)*destLen;
  iVar1 = -5;
  if (*destLen >> 0x20 == 0) {
    local_80.zalloc = (alloc_func)0x0;
    local_80.zfree = (free_func)0x0;
    local_80.opaque = (voidpf)0x0;
    local_80.next_in = source;
    local_80.next_out = dest;
    iVar1 = cm_zlib_deflateInit_(&local_80,level,"1.2.3",0x70);
    if (iVar1 == 0) {
      iVar2 = cm_zlib_deflate(&local_80,4);
      if (iVar2 == 1) {
        *destLen = local_80.total_out;
        iVar1 = cm_zlib_deflateEnd(&local_80);
      }
      else {
        cm_zlib_deflateEnd(&local_80);
        iVar1 = -5;
        if (iVar2 != 0) {
          iVar1 = iVar2;
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int ZEXPORT compress2 (dest, destLen, source, sourceLen, level)
    Bytef *dest;
    uLongf *destLen;
    const Bytef *source;
    uLong sourceLen;
    int level;
{
    z_stream stream;
    int err;

    stream.next_in = (Bytef*)source;
    stream.avail_in = (uInt)sourceLen;
#ifdef MAXSEG_64K
    /* Check for source > 64K on 16-bit machine: */
    if ((uLong)stream.avail_in != sourceLen) return Z_BUF_ERROR;
#endif
    stream.next_out = dest;
    stream.avail_out = (uInt)*destLen;
    if ((uLong)stream.avail_out != *destLen) return Z_BUF_ERROR;

    stream.zalloc = (alloc_func)0;
    stream.zfree = (free_func)0;
    stream.opaque = (voidpf)0;

    err = deflateInit(&stream, level);
    if (err != Z_OK) return err;

    err = deflate(&stream, Z_FINISH);
    if (err != Z_STREAM_END) {
        deflateEnd(&stream);
        return err == Z_OK ? Z_BUF_ERROR : err;
    }
    *destLen = stream.total_out;

    err = deflateEnd(&stream);
    return err;
}